

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hpf1_process_pcm_frames
                    (ma_hpf1 *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint uVar1;
  int iVar2;
  ma_biquad_coefficient *pmVar3;
  ma_result mVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  mVar4 = MA_INVALID_ARGS;
  if (pFramesIn != (void *)0x0 && (pFramesOut != (void *)0x0 && pHPF != (ma_hpf1 *)0x0)) {
    if (pHPF->format == ma_format_f32) {
      if (frameCount != 0) {
        uVar5 = 0;
        do {
          uVar1 = pHPF->channels;
          fVar8 = 1.0 - (pHPF->a).f32;
          uVar6 = 0;
          do {
            pmVar3 = pHPF->pR1;
            fVar9 = *(float *)((long)pFramesIn + uVar6 * 4) * (1.0 - fVar8) +
                    pmVar3[uVar6].f32 * -fVar8;
            *(float *)((long)pFramesOut + uVar6 * 4) = fVar9;
            pmVar3[uVar6].f32 = fVar9;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
          pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 4);
          pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 4);
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < frameCount);
      }
    }
    else {
      if (pHPF->format != ma_format_s16) {
        return MA_INVALID_ARGS;
      }
      if (frameCount != 0) {
        uVar5 = 0;
        do {
          uVar1 = pHPF->channels;
          iVar2 = (pHPF->a).s32;
          uVar6 = 0;
          do {
            pmVar3 = pHPF->pR1;
            iVar7 = pmVar3[uVar6].s32 * (iVar2 + -0x4000) +
                    *(short *)((long)pFramesIn + uVar6 * 2) * iVar2 >> 0xe;
            *(short *)((long)pFramesOut + uVar6 * 2) = (short)iVar7;
            pmVar3[uVar6].s32 = iVar7;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
          pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 2);
          pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 2);
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < frameCount);
      }
    }
    mVar4 = MA_SUCCESS;
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_hpf1_process_pcm_frames(ma_hpf1* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pHPF == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pHPF->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_hpf1_process_pcm_frame_f32(pHPF, pY, pX);
            pY += pHPF->channels;
            pX += pHPF->channels;
        }
    } else if (pHPF->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_hpf1_process_pcm_frame_s16(pHPF, pY, pX);
            pY += pHPF->channels;
            pX += pHPF->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}